

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O2

void doubleCos1D_train<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj,int nTrain)

{
  SrcEvaluatorType srcEvaluator;
  ostream *poVar1;
  double *pdVar2;
  int iVar3;
  bool bVar4;
  result_type_conflict1 rVar5;
  double dVar6;
  uniform_01<double,_double> uniform;
  plain_array<double,_1,_0,_0> local_a50;
  Vec x;
  double local_a38;
  Vec z;
  plain_array<double,_1,_0,_0> local_a10;
  normal_distribution<double> local_a08;
  mt19937 rng;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&rng);
  local_a08._mean = 0.0;
  local_a08._sigma = 1.0;
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z,(int *)&x);
  local_a50.array[0]._0_4_ = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&x,(int *)&local_a50);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Training, y = {cos(x), cos(x)+4}, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nTrain);
  poVar1 = std::operator<<(poVar1," training points ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar3 = 0;
  if (0 < nTrain) {
    iVar3 = nTrain;
  }
  local_a38 = 0.0;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    rVar5 = boost::random::detail::new_uniform_01<double>::operator()
                      ((new_uniform_01<double> *)&uniform,&rng);
    local_a38 = rVar5 * 0.02 + local_a38;
    if (local_a38 <= 0.0) {
      *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           local_a38 + 12.566370614359172;
      dVar6 = cos(local_a38 + 12.566370614359172);
      rVar5 = boost::random::normal_distribution<double>::operator()(&local_a08,&rng);
      pdVar2 = (double *)
               CONCAT44(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data._4_4_,
                        x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data._0_4_);
      dVar6 = rVar5 * 0.1 + dVar6 + 4.0;
    }
    else {
      *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = local_a38
      ;
      dVar6 = cos(local_a38);
      rVar5 = boost::random::normal_distribution<double>::operator()(&local_a08,&rng);
      pdVar2 = (double *)
               CONCAT44(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data._4_4_,
                        x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data._0_4_);
      dVar6 = rVar5 * 0.1 + dVar6;
    }
    *pdVar2 = dVar6;
    local_a50.array[0] =
         (double  [1])
         *z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_a10.array[0] = (double  [1])*pdVar2;
    IMLE<1,_1,_FastLinearExpert>::update(imleObj,(Z *)&local_a50,(X *)&local_a10);
    local_a38 = (double)(~-(ulong)(12.566370614359172 < local_a38) & (ulong)(local_a38 + 0.1) |
                        -(ulong)(12.566370614359172 < local_a38) & 0xc02921fb54442d18);
  }
  free((void *)CONCAT44(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data._4_4_,
                        x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data._0_4_));
  free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void doubleCos1D_train( Learner &imleObj, int nTrain = 2000)
{
    // Noise model
    const Scal NOISE_Z = 0.02;
    const Scal NOISE_X = 0.1;
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    boost::normal_distribution<Scal> normal;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Training
	cout << "\t --- Training, y = {cos(x), cos(x)+4}, " << nTrain << " training points ---" << endl;
	Scal zTrain = 0.0;
    for(int k = 0; k < nTrain; k++)
    {
        zTrain += uniform(rng) * NOISE_Z;

        if( zTrain > 0.0 )      // Lower branch
        {
            z[0] = zTrain;
            x[0] = cos(z[0]) + NOISE_X * normal(rng);
        }
        else                   // Upper branch
        {
            z[0] = zTrain + 4*M_PI;
            x[0] = cos(z[0]) + 4.0 + NOISE_X * normal(rng);
        }

        imleObj.update(z,x);

		if( zTrain > 4*M_PI )
            zTrain = -4*M_PI;
        else
            zTrain += 0.1;
    }
}